

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_strip.c
# Opt level: O1

uint64_t TIFFRasterScanlineSize64(TIFF *tif)

{
  uint64_t uVar1;
  
  uVar1 = _TIFFMultiply64(tif,(ulong)(tif->tif_dir).td_bitspersample,
                          (ulong)(tif->tif_dir).td_imagewidth,"TIFFRasterScanlineSize64");
  if ((tif->tif_dir).td_planarconfig == 1) {
    uVar1 = _TIFFMultiply64(tif,uVar1,(ulong)(tif->tif_dir).td_samplesperpixel,
                            "TIFFRasterScanlineSize64");
    return ((uVar1 >> 3) + 1) - (ulong)((uVar1 & 7) == 0);
  }
  uVar1 = _TIFFMultiply64(tif,((uVar1 >> 3) + 1) - (ulong)((uVar1 & 7) == 0),
                          (ulong)(tif->tif_dir).td_samplesperpixel,"TIFFRasterScanlineSize64");
  return uVar1;
}

Assistant:

uint64_t TIFFRasterScanlineSize64(TIFF *tif)
{
    static const char module[] = "TIFFRasterScanlineSize64";
    TIFFDirectory *td = &tif->tif_dir;
    uint64_t scanline;

    scanline =
        _TIFFMultiply64(tif, td->td_bitspersample, td->td_imagewidth, module);
    if (td->td_planarconfig == PLANARCONFIG_CONTIG)
    {
        scanline =
            _TIFFMultiply64(tif, scanline, td->td_samplesperpixel, module);
        return (TIFFhowmany8_64(scanline));
    }
    else
        return (_TIFFMultiply64(tif, TIFFhowmany8_64(scanline),
                                td->td_samplesperpixel, module));
}